

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int setDateTimeToCurrent(sqlite3_context *context,DateTime *p)

{
  long lVar1;
  int iVar2;
  i64 *pTimeOut;
  sqlite3_int64 iTime;
  i64 local_18;
  
  local_18 = 0;
  pTimeOut = &context->pVdbe->iCurrentTime;
  if (context->pVdbe == (Vdbe *)0x0) {
    pTimeOut = &local_18;
  }
  if ((*pTimeOut == 0) &&
     (iVar2 = sqlite3OsCurrentTimeInt64(context->pOut->db->pVfs,pTimeOut), iVar2 != 0)) {
    *pTimeOut = 0;
  }
  lVar1 = *pTimeOut;
  p->iJD = lVar1;
  if (lVar1 >= 1) {
    p->validJD = '\x01';
  }
  return (uint)(lVar1 < 1);
}

Assistant:

static int setDateTimeToCurrent(sqlite3_context *context, DateTime *p){
  p->iJD = sqlite3StmtCurrentTime(context);
  if( p->iJD>0 ){
    p->validJD = 1;
    return 0;
  }else{
    return 1;
  }
}